

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
::expand(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>_>
         *this)

{
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *pVVar1;
  long lVar2;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
  *pVVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t i;
  ulong uVar7;
  size_t sVar8;
  
  sVar8 = 8;
  if (this->_capacity != 0) {
    sVar8 = this->_capacity * 2;
  }
  pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
            *)Lib::alloc(sVar8 * 8);
  uVar5 = this->_capacity;
  if (uVar5 == 0) {
    sVar4 = 0;
  }
  else {
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      pVVar1 = this->_stack;
      lVar2 = *(long *)((long)&pVVar1->_core + lVar6);
      *(long *)((long)&pVVar3->_core + lVar6) = lVar2;
      if (lVar2 != 0) {
        *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      }
      VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
      ::~VirtualIterator((VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::SuperpositionConf::Lhs>::Node_**>
                          *)((long)&pVVar1->_core + lVar6));
      uVar5 = this->_capacity;
      lVar6 = lVar6 + 8;
    }
    Lib::free(this->_stack);
    sVar4 = this->_capacity;
  }
  this->_stack = pVVar3;
  this->_cursor = pVVar3 + sVar4;
  this->_end = pVVar3 + sVar8;
  this->_capacity = sVar8;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }